

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O0

void tcg_gen_orc_vec_arm(TCGContext_conflict *tcg_ctx,uint vece,TCGv_vec r,TCGv_vec a,TCGv_vec b)

{
  TCGv_vec r_00;
  TCGv_vec t;
  TCGv_vec b_local;
  TCGv_vec a_local;
  TCGv_vec r_local;
  uint vece_local;
  TCGContext_conflict *tcg_ctx_local;
  
  r_00 = tcg_temp_new_vec_matching_arm(tcg_ctx,r);
  tcg_gen_not_vec_arm(tcg_ctx,0,r_00,b);
  tcg_gen_or_vec_arm(tcg_ctx,0,r,a,r_00);
  tcg_temp_free_vec(tcg_ctx,r_00);
  return;
}

Assistant:

void tcg_gen_orc_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, TCGv_vec a, TCGv_vec b)
{
    if (TCG_TARGET_HAS_orc_vec) {
        vec_gen_op3(tcg_ctx, INDEX_op_orc_vec, 0, r, a, b);
    } else {
        TCGv_vec t = tcg_temp_new_vec_matching(tcg_ctx, r);
        tcg_gen_not_vec(tcg_ctx, 0, t, b);
        tcg_gen_or_vec(tcg_ctx, 0, r, a, t);
        tcg_temp_free_vec(tcg_ctx, t);
    }
}